

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

void __thiscall
winmd::reader::CustomAttributeSig::CustomAttributeSig
          (CustomAttributeSig *this,table_base *table,byte_view *data,MethodDefSig *ctor)

{
  database *__args;
  pointer pPVar1;
  unsigned_short uVar2;
  pointer ctor_param;
  bool bVar3;
  allocator<char> local_71;
  vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>> *local_70;
  _Variant_storage<false,_winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
  local_68;
  
  local_70 = (vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>> *)
             &this->m_named_args;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __args = table->m_database;
  uVar2 = read<unsigned_short>(data);
  if (uVar2 != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CustomAttribute blobs must start with prolog of 0x0001",
               &local_71);
    impl::throw_invalid((string *)&local_68);
  }
  pPVar1 = (ctor->m_params).
           super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ctor_param = (ctor->m_params).
                    super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                    ._M_impl.super__Vector_impl_data._M_start; ctor_param != pPVar1;
      ctor_param = ctor_param + 1) {
    FixedArgSig::read_arg((value_type *)&local_68,__args,ctor_param,data);
    std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
    emplace_back<winmd::reader::FixedArgSig>(&this->m_fixed_args,(FixedArgSig *)&local_68);
    std::__detail::__variant::
    _Variant_storage<false,_winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
    ::~_Variant_storage(&local_68);
  }
  uVar2 = read<unsigned_short>(data);
  if ((uint)uVar2 <= (uint)(*(int *)&data->m_last - *(int *)&data->m_first)) {
    std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::reserve
              ((vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_> *)
               local_70,(ulong)uVar2);
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      std::vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>>::
      emplace_back<winmd::reader::database_const&,winmd::reader::byte_view&>(local_70,__args,data);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Invalid blob array size",&local_71);
  impl::throw_invalid((string *)&local_68);
}

Assistant:

CustomAttributeSig(table_base const* table, byte_view& data, MethodDefSig const& ctor)
        {
            database const& db = table->get_database();
            auto const prolog = read<uint16_t>(data);
            if (prolog != 0x0001)
            {
                impl::throw_invalid("CustomAttribute blobs must start with prolog of 0x0001");
            }

            for (auto const& param : ctor.Params())
            {
                m_fixed_args.push_back(FixedArgSig{ db, param, data });
            }

            const auto num_named_args = read<uint16_t>(data);
            if (num_named_args > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_named_args.reserve(num_named_args);

            for (uint16_t i = 0; i < num_named_args; ++i)
            {
                m_named_args.emplace_back(db, data);
            }
        }